

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O0

LY_ERR ly_in_new_fd(int fd,ly_in **in)

{
  void *pvVar1;
  void *pvStack_28;
  LY_ERR ret__;
  char *addr;
  size_t length;
  ly_in **in_local;
  int fd_local;
  
  length = (size_t)in;
  in_local._0_4_ = fd;
  if (fd < 0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","fd >= 0","ly_in_new_fd");
    in_local._4_4_ = LY_EINVAL;
  }
  else if (in == (ly_in **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","in","ly_in_new_fd");
    in_local._4_4_ = LY_EINVAL;
  }
  else {
    in_local._4_4_ = ly_mmap((ly_ctx *)0x0,fd,(size_t *)&addr,&stack0xffffffffffffffd8);
    if (in_local._4_4_ == LY_SUCCESS) {
      if (pvStack_28 == (void *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Empty input file.");
        in_local._4_4_ = LY_EINVAL;
      }
      else {
        pvVar1 = calloc(1,0x40);
        *(void **)length = pvVar1;
        if (*(long *)length == 0) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_in_new_fd");
          ly_munmap(pvStack_28,(size_t)addr);
          in_local._4_4_ = LY_EMEM;
        }
        else {
          **(undefined4 **)length = 0;
          *(int *)(*(long *)length + 0x28) = (int)in_local;
          *(void **)(*(long *)length + 0x10) = pvStack_28;
          *(void **)(*(long *)length + 0x18) = pvStack_28;
          *(void **)(*(long *)length + 8) = pvStack_28;
          *(undefined8 *)(*(long *)length + 0x38) = 1;
          *(char **)(*(long *)length + 0x20) = addr;
          in_local._4_4_ = LY_SUCCESS;
        }
      }
    }
  }
  return in_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_in_new_fd(int fd, struct ly_in **in)
{
    size_t length;
    char *addr;

    LY_CHECK_ARG_RET(NULL, fd >= 0, in, LY_EINVAL);

    LY_CHECK_RET(ly_mmap(NULL, fd, &length, (void **)&addr));
    if (!addr) {
        LOGERR(NULL, LY_EINVAL, "Empty input file.");
        return LY_EINVAL;
    }

    *in = calloc(1, sizeof **in);
    LY_CHECK_ERR_RET(!*in, LOGMEM(NULL); ly_munmap(addr, length), LY_EMEM);

    (*in)->type = LY_IN_FD;
    (*in)->method.fd = fd;
    (*in)->current = (*in)->start = (*in)->func_start = addr;
    (*in)->line = 1;
    (*in)->length = length;

    return LY_SUCCESS;
}